

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Transform * pbrt::RotateX(Transform *__return_storage_ptr__,Float theta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  SquareMatrix<4> local_50;
  
  fVar3 = sinf(theta * 0.017453292);
  local_50.m[1][1] = cosf(theta * 0.017453292);
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = fVar3;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(auVar1,auVar2);
  local_50.m[0][0] = 1.0;
  local_50.m[0][1] = 0.0;
  local_50.m[0][2] = 0.0;
  local_50.m[0][3] = 0.0;
  local_50.m[1][0] = 0.0;
  local_50.m[1][2] = auVar2._0_4_;
  local_50.m[1][3] = 0.0;
  local_50.m[2][0] = 0.0;
  local_50.m[2][3] = 0.0;
  local_50.m[3][0] = 0.0;
  local_50.m[3][1] = 0.0;
  local_50.m[3][2] = 0.0;
  local_50.m[3][3] = 1.0;
  local_50.m[2][1] = fVar3;
  local_50.m[2][2] = local_50.m[1][1];
  Transpose<4>(&__return_storage_ptr__->mInv,&local_50);
  *(ulong *)(__return_storage_ptr__->m).m[0] = CONCAT44(local_50.m[0][1],local_50.m[0][0]);
  *(ulong *)((__return_storage_ptr__->m).m[0] + 2) = CONCAT44(local_50.m[0][3],local_50.m[0][2]);
  *(ulong *)(__return_storage_ptr__->m).m[1] = CONCAT44(local_50.m[1][1],local_50.m[1][0]);
  *(ulong *)((__return_storage_ptr__->m).m[1] + 2) = CONCAT44(local_50.m[1][3],local_50.m[1][2]);
  *(ulong *)(__return_storage_ptr__->m).m[2] = CONCAT44(local_50.m[2][1],local_50.m[2][0]);
  *(ulong *)((__return_storage_ptr__->m).m[2] + 2) = CONCAT44(local_50.m[2][3],local_50.m[2][2]);
  *(ulong *)(__return_storage_ptr__->m).m[3] = CONCAT44(local_50.m[3][1],local_50.m[3][0]);
  *(ulong *)((__return_storage_ptr__->m).m[3] + 2) = CONCAT44(local_50.m[3][3],local_50.m[3][2]);
  return __return_storage_ptr__;
}

Assistant:

Transform RotateX(Float theta) {
    Float sinTheta = std::sin(Radians(theta));
    Float cosTheta = std::cos(Radians(theta));
    SquareMatrix<4> m(1,        0,         0, 0,
                      0, cosTheta, -sinTheta, 0,
                      0, sinTheta,  cosTheta, 0,
                      0,        0,         0, 1);
    return Transform(m, Transpose(m));
}